

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderSupplementalData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderSupplementalData::SetIFFMission
          (Mode5TransponderSupplementalData *this,KUINT8 IFFM)

{
  KException *this_00;
  KString local_40;
  
  if (IFFM < 8) {
    (this->m_SupplementalDataUnion).m_ui8SupplementalData =
         (this->m_SupplementalDataUnion).m_ui8SupplementalData & 0xe3 | IFFM << 2;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SetIFFMission","");
  KException::KException(this_00,&local_40,4);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Mode5TransponderSupplementalData::SetIFFMission(KUINT8 IFFM) noexcept(false)
{
	if( IFFM > 7 )throw KException( __FUNCTION__, DATA_TYPE_TOO_LARGE );
	m_SupplementalDataUnion.m_ui8IFFMission = IFFM;
}